

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O0

void readsmallobjects(uint32 numsmallobjects,uint8 **ptr,uint32 *len,MOJOSHADER_effect *effect,
                     char *profile,MOJOSHADER_swizzle *swiz,uint swizcount,
                     MOJOSHADER_samplerMap *smap,uint smapcount,MOJOSHADER_malloc m,
                     MOJOSHADER_free f,void *d)

{
  uint32 uVar1;
  uint32 bufsize;
  int iVar2;
  uint uVar3;
  MOJOSHADER_effectObject *pMVar4;
  void *pvVar5;
  MOJOSHADER_parseData *pMVar6;
  uint32 blocklen;
  int par;
  uint32 curSampler;
  char mainfn [32];
  char *str_1;
  char *str;
  MOJOSHADER_effectObject *object;
  uint32 length;
  uint32 index;
  int j;
  int i;
  MOJOSHADER_swizzle *swiz_local;
  char *profile_local;
  MOJOSHADER_effect *effect_local;
  uint32 *len_local;
  uint8 **ptr_local;
  uint32 numsmallobjects_local;
  
  if (numsmallobjects != 0) {
    for (index = 1; index < numsmallobjects + 1; index = index + 1) {
      uVar1 = readui32(ptr,len);
      bufsize = readui32(ptr,len);
      pMVar4 = effect->objects + uVar1;
      if (pMVar4->type == MOJOSHADER_SYMTYPE_STRING) {
        if (bufsize != 0) {
          pvVar5 = (*m)(bufsize,d);
          memcpy(pvVar5,*ptr,(ulong)bufsize);
          *(void **)((long)pMVar4 + 8) = pvVar5;
        }
      }
      else if ((((pMVar4->type != MOJOSHADER_SYMTYPE_TEXTURE) &&
                (pMVar4->type != MOJOSHADER_SYMTYPE_TEXTURE1D)) &&
               (pMVar4->type != MOJOSHADER_SYMTYPE_TEXTURE2D)) &&
              ((pMVar4->type != MOJOSHADER_SYMTYPE_TEXTURE3D &&
               (pMVar4->type != MOJOSHADER_SYMTYPE_TEXTURECUBE)))) {
        if ((((pMVar4->type == MOJOSHADER_SYMTYPE_SAMPLER) ||
             ((pMVar4->type == MOJOSHADER_SYMTYPE_SAMPLER1D ||
              (pMVar4->type == MOJOSHADER_SYMTYPE_SAMPLER2D)))) ||
            (pMVar4->type == MOJOSHADER_SYMTYPE_SAMPLER3D)) ||
           (pMVar4->type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)) {
          if (bufsize != 0) {
            pvVar5 = (*m)(bufsize,d);
            memcpy(pvVar5,*ptr,(ulong)bufsize);
            *(void **)((long)pMVar4 + 8) = pvVar5;
          }
        }
        else {
          if ((pMVar4->type != MOJOSHADER_SYMTYPE_PIXELSHADER) &&
             (pMVar4->type != MOJOSHADER_SYMTYPE_VERTEXSHADER)) {
            __assert_fail("0 && \"Small object type unknown!\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_effects.c"
                          ,0x2b1,
                          "void readsmallobjects(const uint32, const uint8 **, uint32 *, MOJOSHADER_effect *, const char *, const MOJOSHADER_swizzle *, const unsigned int, const MOJOSHADER_samplerMap *, const unsigned int, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                         );
          }
          snprintf((char *)&par,0x20,"ShaderFunction%u",(ulong)uVar1);
          *(int *)((long)pMVar4 + 4) = -1;
          *(int *)((long)pMVar4 + 8) = -1;
          pMVar6 = MOJOSHADER_parse(profile,(char *)&par,*ptr,bufsize,swiz,swizcount,smap,smapcount,
                                    m,f,d);
          *(MOJOSHADER_parseData **)((long)pMVar4 + 0x40) = pMVar6;
          for (length = 0; (int)length < *(int *)(*(long *)((long)pMVar4 + 0x40) + 0xa0);
              length = length + 1) {
            if (*(int *)(*(long *)(*(long *)((long)pMVar4 + 0x40) + 0xa8) + (long)(int)length * 0x38
                        + 8) == 3) {
              *(int *)((long)pMVar4 + 0x30) = *(int *)((long)pMVar4 + 0x30) + 1;
            }
          }
          *(int *)((long)pMVar4 + 0x20) = *(int *)(*(long *)((long)pMVar4 + 0x40) + 0xa0);
          pvVar5 = (*m)(*(int *)((long)pMVar4 + 0x20) << 2,d);
          *(void **)((long)pMVar4 + 0x28) = pvVar5;
          pvVar5 = (*m)(*(int *)((long)pMVar4 + 0x30) * 0x18,d);
          *(void **)((long)pMVar4 + 0x38) = pvVar5;
          blocklen = 0;
          for (length = 0; (int)length < *(int *)(*(long *)((long)pMVar4 + 0x40) + 0xa0);
              length = length + 1) {
            iVar2 = findparameter(effect->params,effect->param_count,
                                  *(char **)(*(long *)(*(long *)((long)pMVar4 + 0x40) + 0xa8) +
                                            (long)(int)length * 0x38));
            *(int *)(*(long *)((long)pMVar4 + 0x28) + (long)(int)length * 4) = iVar2;
            if (*(int *)(*(long *)(*(long *)((long)pMVar4 + 0x40) + 0xa8) + (long)(int)length * 0x38
                        + 8) == 3) {
              *(undefined8 *)(*(long *)((long)pMVar4 + 0x38) + (ulong)blocklen * 0x18) =
                   *(undefined8 *)
                    (*(long *)(*(long *)((long)pMVar4 + 0x40) + 0xa8) + (long)(int)length * 0x38);
              *(undefined4 *)(*(long *)((long)pMVar4 + 0x38) + (ulong)blocklen * 0x18 + 8) =
                   *(undefined4 *)
                    (*(long *)(*(long *)((long)pMVar4 + 0x40) + 0xa8) + (long)(int)length * 0x38 +
                    0xc);
              *(uint *)(*(long *)((long)pMVar4 + 0x38) + (ulong)blocklen * 0x18 + 0xc) =
                   effect->params[iVar2].value.value_count;
              *(anon_union_8_20_d40dc30a_for_MOJOSHADER_effectValue_4 *)
               (*(long *)((long)pMVar4 + 0x38) + (ulong)blocklen * 0x18 + 0x10) =
                   effect->params[iVar2].value.field_4;
              blocklen = blocklen + 1;
            }
          }
          if (*(long *)(*(long *)((long)pMVar4 + 0x40) + 0xb0) != 0) {
            *(int *)((long)pMVar4 + 0x10) =
                 *(int *)(*(long *)(*(long *)((long)pMVar4 + 0x40) + 0xb0) + 0x14);
            pvVar5 = (*m)(*(int *)((long)pMVar4 + 0x10) << 2,d);
            *(void **)((long)pMVar4 + 0x18) = pvVar5;
            for (length = 0;
                length < *(uint *)(*(long *)(*(long *)((long)pMVar4 + 0x40) + 0xb0) + 0x14);
                length = length + 1) {
              iVar2 = findparameter(effect->params,effect->param_count,
                                    *(char **)(*(long *)(*(long *)(*(long *)((long)pMVar4 + 0x40) +
                                                                  0xb0) + 0x18) +
                                              (long)(int)length * 0x38));
              *(int *)(*(long *)((long)pMVar4 + 0x18) + (long)(int)length * 4) = iVar2;
            }
          }
        }
      }
      uVar3 = (bufsize + 3) - (bufsize - 1 & 3);
      *ptr = *ptr + uVar3;
      *len = *len - uVar3;
    }
  }
  return;
}

Assistant:

static void readsmallobjects(const uint32 numsmallobjects,
                             const uint8 **ptr,
                             uint32 *len,
                             MOJOSHADER_effect *effect,
                             const char *profile,
                             const MOJOSHADER_swizzle *swiz,
                             const unsigned int swizcount,
                             const MOJOSHADER_samplerMap *smap,
                             const unsigned int smapcount,
                             MOJOSHADER_malloc m,
                             MOJOSHADER_free f,
                             void *d)
{
    int i, j;
    if (numsmallobjects == 0) return;

    for (i = 1; i < numsmallobjects + 1; i++)
    {
        const uint32 index = readui32(ptr, len);
        const uint32 length = readui32(ptr, len);

        MOJOSHADER_effectObject *object = &effect->objects[index];
        if (object->type == MOJOSHADER_SYMTYPE_STRING)
        {
            if (length > 0)
            {
                char *str = (char *) m(length, d);
                memcpy(str, *ptr, length);
                object->string.string = str;
            } // if
        } // if
        else if (object->type == MOJOSHADER_SYMTYPE_TEXTURE
              || object->type == MOJOSHADER_SYMTYPE_TEXTURE1D
              || object->type == MOJOSHADER_SYMTYPE_TEXTURE2D
              || object->type == MOJOSHADER_SYMTYPE_TEXTURE3D
              || object->type == MOJOSHADER_SYMTYPE_TEXTURECUBE)
        {
            // No-op. Why is this even here?
        } // else if
        else if (object->type == MOJOSHADER_SYMTYPE_SAMPLER
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER1D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER2D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLER3D
              || object->type == MOJOSHADER_SYMTYPE_SAMPLERCUBE)
        {
            if (length > 0)
            {
                char *str = (char *) m(length, d);
                memcpy(str, *ptr, length);
                object->mapping.name = str;
            } // if
        } // else if
        else if (object->type == MOJOSHADER_SYMTYPE_PIXELSHADER
              || object->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            char mainfn[32];
            snprintf(mainfn, sizeof (mainfn), "ShaderFunction%u", (unsigned int) index);
            object->shader.technique = -1;
            object->shader.pass = -1;
            object->shader.shader = MOJOSHADER_parse(profile, mainfn, *ptr, length,
                                                     swiz, swizcount, smap, smapcount,
                                                     m, f, d);
            // !!! FIXME: check for errors.
            for (j = 0; j < object->shader.shader->symbol_count; j++)
                if (object->shader.shader->symbols[j].register_set == MOJOSHADER_SYMREGSET_SAMPLER)
                    object->shader.sampler_count++;
            object->shader.param_count = object->shader.shader->symbol_count;
            object->shader.params = (uint32 *) m(object->shader.param_count * sizeof (uint32), d);
            object->shader.samplers = (MOJOSHADER_samplerStateRegister *) m(object->shader.sampler_count * sizeof (MOJOSHADER_samplerStateRegister), d);
            uint32 curSampler = 0;
            for (j = 0; j < object->shader.shader->symbol_count; j++)
            {
                int par = findparameter(effect->params,
                                        effect->param_count,
                                        object->shader.shader->symbols[j].name);
                object->shader.params[j] = par;
                if (object->shader.shader->symbols[j].register_set == MOJOSHADER_SYMREGSET_SAMPLER)
                {
                    object->shader.samplers[curSampler].sampler_name = object->shader.shader->symbols[j].name;
                    object->shader.samplers[curSampler].sampler_register = object->shader.shader->symbols[j].register_index;
                    object->shader.samplers[curSampler].sampler_state_count = effect->params[par].value.value_count;
                    object->shader.samplers[curSampler].sampler_states = effect->params[par].value.valuesSS;
                    curSampler++;
                } // if
            } // for
            if (object->shader.shader->preshader)
            {
                object->shader.preshader_param_count = object->shader.shader->preshader->symbol_count;
                object->shader.preshader_params = (uint32 *) m(object->shader.preshader_param_count * sizeof (uint32), d);
                for (j = 0; j < object->shader.shader->preshader->symbol_count; j++)
                {
                    object->shader.preshader_params[j] = findparameter(effect->params,
                                                                       effect->param_count,
                                                                       object->shader.shader->preshader->symbols[j].name);
                } // for
            } // if
        } // else if
        else
        {
            assert(0 && "Small object type unknown!");
        } // else

        /* Object block is always a multiple of four */
        const uint32 blocklen = (length + 3) - ((length - 1) % 4);
        *ptr += blocklen;
        *len -= blocklen;
    } // for
}